

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash.cc
# Opt level: O0

uint128_t farmhashcc::CityHash128WithSeed(char *s,size_t len,uint128_t seed)

{
  uint128_t seed_00;
  uint128_t x_00;
  unsigned_long uVar1;
  uint64_t uVar2;
  long lVar3;
  uint64_t uVar4;
  char *s_00;
  uint64_t u;
  uint64_t uVar5;
  unsigned_long in_RCX;
  util *in_RDX;
  unsigned_long extraout_RDX;
  ulong in_RSI;
  char *in_RDI;
  char *p;
  uint128_t x_01;
  size_t tail_done;
  uint64_t z;
  uint64_t y;
  uint64_t x;
  pair<unsigned_long,_unsigned_long> w;
  pair<unsigned_long,_unsigned_long> v;
  int in_stack_fffffffffffffe6c;
  unsigned_long in_stack_fffffffffffffe70;
  uint64_t in_stack_fffffffffffffe80;
  size_t in_stack_fffffffffffffee8;
  char *in_stack_fffffffffffffef0;
  unsigned_long in_stack_fffffffffffffef8;
  unsigned_long in_stack_ffffffffffffff00;
  unsigned_long local_f8;
  pair<unsigned_long,_unsigned_long> local_f0;
  ulong local_e0;
  pair<unsigned_long,_unsigned_long> local_d8;
  pair<unsigned_long,_unsigned_long> local_c8;
  pair<unsigned_long,_unsigned_long> local_b8;
  pair<unsigned_long,_unsigned_long> local_a8;
  unsigned_long local_98;
  util *local_90;
  unsigned_long local_88;
  uint64_t local_80;
  util *local_78;
  unsigned_long local_70;
  uint64_t local_68;
  pair<unsigned_long,_unsigned_long> local_60;
  pair<unsigned_long,_unsigned_long> local_50 [2];
  ulong local_30;
  char *local_28;
  util *local_20;
  unsigned_long local_18;
  uint128_t local_10;
  
  if (in_RSI < 0x80) {
    seed_00.second = in_stack_ffffffffffffff00;
    seed_00.first = in_stack_fffffffffffffef8;
    local_10 = CityMurmur(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,seed_00);
  }
  else {
    local_30 = in_RSI;
    local_28 = in_RDI;
    local_20 = in_RDX;
    local_18 = in_RCX;
    std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long,_unsigned_long,_true>(local_50);
    std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long,_unsigned_long,_true>(&local_60);
    local_78 = local_20;
    local_70 = local_18;
    x_00.second = local_18;
    x_00.first = (unsigned_long)local_20;
    local_68 = util::Uint128Low64(x_00);
    local_90 = local_20;
    local_88 = local_18;
    x_01.second = extraout_RDX;
    x_01.first = local_18;
    local_80 = util::Uint128High64(local_20,x_01);
    local_98 = local_30 * -0x4b6d499041670d8d;
    uVar2 = util::Rotate64(in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
    lVar3 = uVar2 * -0x4b6d499041670d8d;
    uVar2 = util::Fetch64(local_28);
    local_50[0].first = lVar3 + uVar2;
    uVar2 = util::Rotate64(in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
    lVar3 = uVar2 * -0x4b6d499041670d8d;
    uVar2 = util::Fetch64(local_28 + 8);
    local_50[0].second = lVar3 + uVar2;
    uVar2 = util::Rotate64(in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
    local_60.first = uVar2 * -0x4b6d499041670d8d + local_68;
    util::Fetch64(local_28 + 0x58);
    local_60.second = util::Rotate64(in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
    local_60.second = local_60.second * -0x4b6d499041670d8d;
    do {
      uVar2 = local_68 + local_80 + local_50[0].first;
      util::Fetch64(local_28 + 8);
      uVar4 = util::Rotate64(in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
      local_68 = uVar4 * -0x4b6d499041670d8d;
      s_00 = (char *)(local_80 + local_50[0].second);
      util::Fetch64(local_28 + 0x30);
      local_80 = util::Rotate64(in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
      uVar1 = local_50[0].first;
      local_80 = local_80 * -0x4b6d499041670d8d;
      local_68 = local_60.second ^ local_68;
      uVar4 = util::Fetch64(local_28 + 0x28);
      local_80 = uVar1 + uVar4 + local_80;
      uVar4 = util::Rotate64(in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
      local_98 = uVar4 * -0x4b6d499041670d8d;
      local_a8 = WeakHashLen32WithSeeds(s_00,uVar2,in_stack_fffffffffffffe80);
      std::pair<unsigned_long,_unsigned_long>::operator=(local_50,&local_a8);
      util::Fetch64(local_28 + 0x10);
      local_b8 = WeakHashLen32WithSeeds(s_00,uVar2,in_stack_fffffffffffffe80);
      std::pair<unsigned_long,_unsigned_long>::operator=(&local_60,&local_b8);
      std::swap<unsigned_long>(&local_98,&local_68);
      p = local_28 + 0x48;
      local_28 = local_28 + 0x40;
      util::Fetch64(p);
      uVar4 = util::Rotate64(in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
      local_68 = uVar4 * -0x4b6d499041670d8d;
      util::Fetch64(local_28 + 0x30);
      local_80 = util::Rotate64(in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
      uVar1 = local_50[0].first;
      local_80 = local_80 * -0x4b6d499041670d8d;
      local_68 = local_60.second ^ local_68;
      uVar4 = util::Fetch64(local_28 + 0x28);
      local_80 = uVar1 + uVar4 + local_80;
      uVar4 = util::Rotate64(in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
      local_98 = uVar4 * -0x4b6d499041670d8d;
      local_c8 = WeakHashLen32WithSeeds(s_00,uVar2,in_stack_fffffffffffffe80);
      std::pair<unsigned_long,_unsigned_long>::operator=(local_50,&local_c8);
      util::Fetch64(local_28 + 0x10);
      local_d8 = WeakHashLen32WithSeeds(s_00,uVar2,in_stack_fffffffffffffe80);
      std::pair<unsigned_long,_unsigned_long>::operator=(&local_60,&local_d8);
      std::swap<unsigned_long>(&local_98,&local_68);
      local_28 = local_28 + 0x40;
      local_30 = local_30 - 0x80;
    } while (0x7f < local_30);
    uVar4 = util::Rotate64(in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
    local_68 = uVar4 * -0x3c5a37a36834ced9 + local_68;
    uVar4 = local_80 * -0x3c5a37a36834ced9;
    local_80 = util::Rotate64(in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
    local_80 = uVar4 + local_80;
    u = local_98 * -0x3c5a37a36834ced9;
    uVar5 = util::Rotate64(in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
    local_98 = u + uVar5;
    local_60.first = local_60.first * 9;
    local_e0 = 0;
    while (local_50[0].first = local_50[0].first * -0x3c5a37a36834ced9, local_e0 < local_30) {
      local_e0 = local_e0 + 0x20;
      uVar5 = util::Rotate64(in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
      local_80 = uVar5 * -0x3c5a37a36834ced9 + local_50[0].second;
      uVar5 = util::Fetch64(local_28 + (local_30 - local_e0) + 0x10);
      local_60.first = uVar5 + local_60.first;
      local_68 = local_68 * -0x3c5a37a36834ced9 + local_60.first;
      in_stack_fffffffffffffe70 = local_60.second;
      uVar5 = util::Fetch64(local_28 + (local_30 - local_e0));
      local_98 = in_stack_fffffffffffffe70 + uVar5 + local_98;
      local_60.second = local_50[0].first + local_60.second;
      local_f0 = WeakHashLen32WithSeeds(s_00,uVar2,u);
      std::pair<unsigned_long,_unsigned_long>::operator=(local_50,&local_f0);
    }
    local_68 = HashLen16(u,uVar4);
    local_80 = HashLen16(u,uVar4);
    uVar2 = HashLen16(u,uVar4);
    local_f8 = uVar2 + local_80;
    HashLen16(u,uVar4);
    std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long,_unsigned_long,_true>
              (&local_10,&local_f8,(unsigned_long *)&stack0xffffffffffffff00);
  }
  return local_10;
}

Assistant:

uint128_t CityHash128WithSeed(const char *s, size_t len, uint128_t seed) {
  if (len < 128) {
    return CityMurmur(s, len, seed);
  }

  // We expect len >= 128 to be the common case.  Keep 56 bytes of state:
  // v, w, x, y, and z.
  pair<uint64_t, uint64_t> v, w;
  uint64_t x = Uint128Low64(seed);
  uint64_t y = Uint128High64(seed);
  uint64_t z = len * k1;
  v.first = Rotate(y ^ k1, 49) * k1 + Fetch(s);
  v.second = Rotate(v.first, 42) * k1 + Fetch(s + 8);
  w.first = Rotate(y + z, 35) * k1 + x;
  w.second = Rotate(x + Fetch(s + 88), 53) * k1;

  // This is the same inner loop as CityHash64(), manually unrolled.
  do {
    x = Rotate(x + y + v.first + Fetch(s + 8), 37) * k1;
    y = Rotate(y + v.second + Fetch(s + 48), 42) * k1;
    x ^= w.second;
    y += v.first + Fetch(s + 40);
    z = Rotate(z + w.first, 33) * k1;
    v = WeakHashLen32WithSeeds(s, v.second * k1, x + w.first);
    w = WeakHashLen32WithSeeds(s + 32, z + w.second, y + Fetch(s + 16));
    std::swap(z, x);
    s += 64;
    x = Rotate(x + y + v.first + Fetch(s + 8), 37) * k1;
    y = Rotate(y + v.second + Fetch(s + 48), 42) * k1;
    x ^= w.second;
    y += v.first + Fetch(s + 40);
    z = Rotate(z + w.first, 33) * k1;
    v = WeakHashLen32WithSeeds(s, v.second * k1, x + w.first);
    w = WeakHashLen32WithSeeds(s + 32, z + w.second, y + Fetch(s + 16));
    std::swap(z, x);
    s += 64;
    len -= 128;
  } while (LIKELY(len >= 128));
  x += Rotate(v.first + z, 49) * k0;
  y = y * k0 + Rotate(w.second, 37);
  z = z * k0 + Rotate(w.first, 27);
  w.first *= 9;
  v.first *= k0;
  // If 0 < len < 128, hash up to 4 chunks of 32 bytes each from the end of s.
  for (size_t tail_done = 0; tail_done < len; ) {
    tail_done += 32;
    y = Rotate(x + y, 42) * k0 + v.second;
    w.first += Fetch(s + len - tail_done + 16);
    x = x * k0 + w.first;
    z += w.second + Fetch(s + len - tail_done);
    w.second += v.first;
    v = WeakHashLen32WithSeeds(s + len - tail_done, v.first + z, v.second);
    v.first *= k0;
  }
  // At this point our 56 bytes of state should contain more than
  // enough information for a strong 128-bit hash.  We use two
  // different 56-byte-to-8-byte hashes to get a 16-byte final result.
  x = HashLen16(x, v.first);
  y = HashLen16(y + z, w.first);
  return uint128_t(HashLen16(x + v.second, w.second) + y,
                   HashLen16(x + w.second, y + v.second));
}